

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDfs.c
# Opt level: O2

int Aig_ManVerifyTopoOrder(Aig_Man_t *p)

{
  int *piVar1;
  Tim_Man_t *pTVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iCo;
  uint uVar6;
  Aig_Obj_t *pObj;
  ulong uVar7;
  Aig_Obj_t *pObj_00;
  int i;
  char *pcVar8;
  bool bVar9;
  
  Aig_ManSetCioIds(p);
  Aig_ManIncrementTravId(p);
  i = 0;
  do {
    if (p->vObjs->nSize <= i) {
      Aig_ManCleanCioIds(p);
      return 1;
    }
    pObj = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,i);
    if (pObj != (Aig_Obj_t *)0x0) {
      uVar3 = (uint)*(undefined8 *)&pObj->field_0x18;
      if ((uVar3 & 7) - 7 < 0xfffffffe) {
        uVar3 = uVar3 & 7;
        if ((ulong)uVar3 - 3 < 2) {
          uVar7 = (ulong)pObj->pFanin0 & 0xfffffffffffffffe;
          if (*(int *)(uVar7 + 0x20) != p->nTravIds) goto LAB_004f5b6b;
        }
        else if (uVar3 == 2) {
          pTVar2 = (Tim_Man_t *)p->pManTime;
          if (pTVar2 != (Tim_Man_t *)0x0) {
            iVar4 = Aig_ObjCioId(pObj);
            uVar3 = Tim_ManBoxForCi(pTVar2,iVar4);
            if (-1 < (int)uVar3) {
              iVar4 = Tim_ManBoxInputFirst((Tim_Man_t *)p->pManTime,uVar3);
              iVar5 = Tim_ManBoxInputNum((Tim_Man_t *)p->pManTime,uVar3);
              if (iVar5 < 1) {
                iVar5 = 0;
              }
              while (bVar9 = iVar5 != 0, iVar5 = iVar5 + -1, bVar9) {
                pObj_00 = Aig_ManCo(p,iVar4);
                pTVar2 = (Tim_Man_t *)p->pManTime;
                iCo = Aig_ObjCioId(pObj_00);
                uVar6 = Tim_ManBoxForCo(pTVar2,iCo);
                if (uVar6 != uVar3) {
                  pcVar8 = 
                  "Tim_ManBoxForCo( (Tim_Man_t *)p->pManTime, Aig_ObjCioId(pNext) ) == iBox";
                  uVar3 = 0x5a;
                  goto LAB_004f5bbd;
                }
                iVar4 = iVar4 + 1;
                if (pObj_00->TravId != p->nTravIds) {
                  uVar6 = pObj_00->Id;
                  pcVar8 = "Box %d has input %d that is not in a topological order.\n";
                  goto LAB_004f5b8e;
                }
              }
            }
          }
        }
        else {
          iVar4 = Aig_ObjIsConst1(pObj);
          if (iVar4 == 0) {
            pcVar8 = "0";
            uVar3 = 0x65;
LAB_004f5bbd:
            __assert_fail(pcVar8,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigDfs.c"
                          ,uVar3,"int Aig_ManVerifyTopoOrder(Aig_Man_t *)");
          }
        }
      }
      else {
        uVar7 = (ulong)pObj->pFanin0 & 0xfffffffffffffffe;
        piVar1 = (int *)(uVar7 + 0x20);
        if ((*piVar1 != p->nTravIds) ||
           (uVar7 = (ulong)pObj->pFanin1 & 0xfffffffffffffffe, *(int *)(uVar7 + 0x20) != *piVar1)) {
LAB_004f5b6b:
          uVar3 = pObj->Id;
          uVar6 = *(uint *)(uVar7 + 0x24);
          pcVar8 = "Node %d has fanin %d that is not in a topological order.\n";
LAB_004f5b8e:
          printf(pcVar8,(ulong)uVar3,(ulong)uVar6);
          return 0;
        }
      }
      pObj->TravId = p->nTravIds;
    }
    i = i + 1;
  } while( true );
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Verifies that the objects are in a topo order.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Aig_ManVerifyTopoOrder( Aig_Man_t * p )
{
    Aig_Obj_t * pObj, * pNext;
    int i, k, iBox, iTerm1, nTerms;
    Aig_ManSetCioIds( p );
    Aig_ManIncrementTravId( p );
    Aig_ManForEachObj( p, pObj, i )
    {
        if ( Aig_ObjIsNode(pObj) )
        {
            pNext = Aig_ObjFanin0(pObj);
            if ( !Aig_ObjIsTravIdCurrent(p,pNext) )
            {
                printf( "Node %d has fanin %d that is not in a topological order.\n", pObj->Id, pNext->Id );
                return 0;
            }
            pNext = Aig_ObjFanin1(pObj);
            if ( !Aig_ObjIsTravIdCurrent(p,pNext) )
            {
                printf( "Node %d has fanin %d that is not in a topological order.\n", pObj->Id, pNext->Id );
                return 0;
            }
        }
        else if ( Aig_ObjIsCo(pObj) || Aig_ObjIsBuf(pObj) )
        {
            pNext = Aig_ObjFanin0(pObj);
            if ( !Aig_ObjIsTravIdCurrent(p,pNext) )
            {
                printf( "Node %d has fanin %d that is not in a topological order.\n", pObj->Id, pNext->Id );
                return 0;
            }
        }
        else if ( Aig_ObjIsCi(pObj) )
        {
            if ( p->pManTime )
            {
                iBox = Tim_ManBoxForCi( (Tim_Man_t *)p->pManTime, Aig_ObjCioId(pObj) );
                if ( iBox >= 0 ) // this is not a true PI
                {
                    iTerm1 = Tim_ManBoxInputFirst( (Tim_Man_t *)p->pManTime, iBox );
                    nTerms = Tim_ManBoxInputNum( (Tim_Man_t *)p->pManTime, iBox );
                    for ( k = 0; k < nTerms; k++ )
                    {
                        pNext = Aig_ManCo( p, iTerm1 + k );
                        assert( Tim_ManBoxForCo( (Tim_Man_t *)p->pManTime, Aig_ObjCioId(pNext) ) == iBox ); 
                        if ( !Aig_ObjIsTravIdCurrent(p,pNext) )
                        {
                            printf( "Box %d has input %d that is not in a topological order.\n", iBox, pNext->Id );
                            return 0;
                        }
                    }
                }
            }
        }
        else if ( !Aig_ObjIsConst1(pObj) )
            assert( 0 );
        Aig_ObjSetTravIdCurrent( p, pObj );
    }
    Aig_ManCleanCioIds( p );
    return 1;
}